

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
helics::apps::generateAliases
          (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,apps *this,string_view target,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  _Rb_tree_header *p_Var1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  char *pcVar3;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  _Var4;
  type match_1;
  ulong uVar5;
  type match;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
  pVar6;
  pair<std::_Rb_tree_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool> pVar7;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  matchList;
  void *local_68;
  iterator iStack_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_48;
  key_type local_40;
  
  local_48 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)target._M_str;
  local_40._M_str = (char *)target._M_len;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_len = (size_t)this;
  pVar6 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::equal_range(local_48,&local_40);
  _Var4._M_cur = (__node_type *)
                 pVar6.first.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                 ._M_cur;
  if (_Var4._M_cur != (__node_type *)0x0) {
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,&local_40);
    local_68 = (void *)0x0;
    iStack_60._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_58 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
            )_Var4._M_cur !=
           pVar6.second.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
        ; _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt) {
      pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&((_Var4._M_cur)->
                       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_storage._M_storage + 0x10);
      std::
      _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>const&>
                ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,pbVar2);
      if (iStack_60._M_current == local_58) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_68,iStack_60,pbVar2);
      }
      else {
        pcVar3 = *(char **)((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_storage._M_storage + 0x18);
        (iStack_60._M_current)->_M_len = pbVar2->_M_len;
        (iStack_60._M_current)->_M_str = pcVar3;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
    }
    if (0x10 < (ulong)((long)iStack_60._M_current - (long)local_68)) {
      uVar5 = 1;
      do {
        pVar6 = CLI::std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                ::equal_range(local_48,(key_type *)(uVar5 * 0x10 + (long)local_68));
        for (_Var4._M_cur = (__node_type *)
                            pVar6.first.
                            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                            ._M_cur;
            (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
             )_Var4._M_cur !=
            pVar6.second.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
            ; _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt) {
          pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&((_Var4._M_cur)->
                           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_storage._M_storage + 0x10);
          pVar7 = std::
                  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>const&>
                            ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                              *)__return_storage_ptr__,pbVar2);
          if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (iStack_60._M_current == local_58) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)&local_68,iStack_60,pbVar2);
            }
            else {
              pcVar3 = *(char **)((long)&((_Var4._M_cur)->
                                         super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                         ._M_storage._M_storage + 0x18);
              (iStack_60._M_current)->_M_len = pbVar2->_M_len;
              (iStack_60._M_current)->_M_str = pcVar3;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 4));
    }
    if (local_68 != (void *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::set<std::string_view>
    generateAliases(const std::string_view target,
                    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    std::set<std::string_view> matches;
    auto [first, last] = aliases.equal_range(target);
    if (first == aliases.end()) {
        return matches;
    }
    matches.emplace(target);
    std::vector<std::string_view> matchList;
    for (auto match = first; match != last; ++match) {
        matches.emplace(match->second);
        matchList.emplace_back(match->second);
    }
    std::size_t cascadeIndex{1};
    while (cascadeIndex < matchList.size()) {
        std::tie(first, last) = aliases.equal_range(matchList[cascadeIndex]);
        for (auto match = first; match != last; ++match) {
            auto [iterator, newAlias] = matches.emplace(match->second);
            if (newAlias) {
                matchList.emplace_back(match->second);
            }
        }
        ++cascadeIndex;
    }
    return matches;
}